

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_fma.cpp
# Opt level: O3

void ncnn::pack_B_tile_quantize(Mat *B,Mat *BT,int j,int max_jj,int k,int max_kk,float scale)

{
  float *pfVar1;
  undefined4 uVar2;
  int iVar3;
  void *pvVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [16];
  int iVar11;
  int iVar12;
  int iVar13;
  size_t *psVar14;
  ulong uVar15;
  uint uVar16;
  undefined1 (*pauVar17) [16];
  long lVar18;
  long lVar19;
  long lVar20;
  ulong uVar21;
  float *pfVar22;
  long lVar23;
  ulong uVar24;
  undefined1 (*pauVar25) [16];
  long lVar26;
  ulong *puVar27;
  uint uVar28;
  long lVar29;
  long lVar30;
  float fVar31;
  undefined4 in_XMM0_Db;
  float fVar32;
  undefined4 in_XMM0_Dc;
  float fVar33;
  undefined4 in_XMM0_Dd;
  float fVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [32];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  float fVar79;
  undefined1 auVar84 [16];
  float fVar99;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar91 [32];
  float fVar97;
  float fVar98;
  float fVar100;
  float fVar101;
  float fVar102;
  undefined1 in_ZMM9 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  float fVar103;
  undefined1 auVar106 [16];
  float fVar118;
  undefined1 auVar107 [16];
  undefined1 auVar112 [32];
  float fVar116;
  float fVar117;
  float fVar119;
  float fVar120;
  float fVar121;
  undefined1 in_ZMM10 [64];
  undefined1 auVar114 [64];
  undefined1 auVar115 [64];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar113 [32];
  
  iVar11 = cpu_support_x86_avx_vnni_int8();
  if (iVar11 != 0) {
    pack_B_tile_fp32_to_int8_avxvnniint8(B,BT,j,max_jj,k,max_kk,scale);
    return;
  }
  iVar11 = cpu_support_x86_avx_vnni();
  if (iVar11 == 0) {
    iVar11 = cpu_support_x86_avx2();
    auVar35 = _DAT_005b32b0;
    auVar5 = _DAT_005b32a0;
    if (iVar11 == 0) {
      iVar11 = B->elempack;
      psVar14 = (size_t *)&B->w;
      if (B->dims == 3) {
        psVar14 = &B->cstep;
      }
      iVar3 = (int)*psVar14;
      pauVar17 = (undefined1 (*) [16])BT->data;
      uVar24 = 0;
      lVar18 = (long)iVar3;
      lVar26 = (long)j;
      auVar10._4_4_ = in_XMM0_Db;
      auVar10._0_4_ = scale;
      auVar10._8_4_ = in_XMM0_Dc;
      auVar10._12_4_ = in_XMM0_Dd;
      if (7 < max_jj) {
        auVar39 = vshufps_avx(auVar10,auVar10,0);
        lVar20 = (long)(iVar3 * 4);
        iVar13 = iVar3 * 7;
        uVar28 = max_kk & 0xfffffffe;
        auVar38._8_4_ = 0x80000000;
        auVar38._0_8_ = 0x8000000080000000;
        auVar38._12_4_ = 0x80000000;
        auVar38._16_4_ = 0x80000000;
        auVar38._20_4_ = 0x80000000;
        auVar38._24_4_ = 0x80000000;
        auVar38._28_4_ = 0x80000000;
        auVar42._8_4_ = 0x3f000000;
        auVar42._0_8_ = 0x3f0000003f000000;
        auVar42._12_4_ = 0x3f000000;
        auVar42._16_4_ = 0x3f000000;
        auVar42._20_4_ = 0x3f000000;
        auVar42._24_4_ = 0x3f000000;
        auVar42._28_4_ = 0x3f000000;
        auVar43._8_4_ = 0x7f007f;
        auVar43._0_8_ = 0x7f007f007f007f;
        auVar43._12_4_ = 0x7f007f;
        auVar47._8_4_ = 0xff81ff81;
        auVar47._0_8_ = 0xff81ff81ff81ff81;
        auVar47._12_4_ = 0xff81ff81;
        auVar62._8_4_ = 0x7f007f;
        auVar62._0_8_ = 0x7f007f007f007f;
        auVar62._12_4_ = 0x7f007f;
        auVar75._8_4_ = 0xff81ff81;
        auVar75._0_8_ = 0xff81ff81ff81ff81;
        auVar75._12_4_ = 0xff81ff81;
        uVar21 = 0;
        do {
          pfVar22 = (float *)((long)B->data +
                             (long)(iVar11 * k) * 4 + (uVar21 + lVar26) * lVar18 * 4);
          fVar31 = auVar39._0_4_;
          fVar32 = auVar39._4_4_;
          fVar33 = auVar39._8_4_;
          fVar34 = auVar39._12_4_;
          if (iVar11 == 8) {
            uVar16 = 0;
            if (1 < max_kk) {
              iVar12 = 1;
              do {
                auVar94._0_4_ = fVar31 * *pfVar22;
                auVar94._4_4_ = fVar32 * pfVar22[1];
                auVar94._8_4_ = fVar33 * pfVar22[2];
                auVar94._12_4_ = fVar34 * pfVar22[3];
                auVar94._16_4_ = fVar31 * pfVar22[4];
                auVar94._20_4_ = fVar32 * pfVar22[5];
                auVar94._28_36_ = in_ZMM9._28_36_;
                auVar94._24_4_ = fVar33 * pfVar22[6];
                auVar114._0_4_ = fVar31 * pfVar22[8];
                auVar114._4_4_ = fVar32 * pfVar22[9];
                auVar114._8_4_ = fVar33 * pfVar22[10];
                auVar114._12_4_ = fVar34 * pfVar22[0xb];
                auVar114._16_4_ = fVar31 * pfVar22[0xc];
                auVar114._20_4_ = fVar32 * pfVar22[0xd];
                auVar114._28_36_ = in_ZMM10._28_36_;
                auVar114._24_4_ = fVar33 * pfVar22[0xe];
                auVar108 = vandps_avx(auVar94._0_32_,auVar38);
                auVar88 = vandps_avx(auVar114._0_32_,auVar38);
                auVar108 = vorps_avx(auVar108,auVar42);
                auVar88 = vorps_avx(auVar88,auVar42);
                auVar80._0_4_ = (int)(auVar94._0_4_ + auVar108._0_4_);
                auVar80._4_4_ = (int)(auVar94._4_4_ + auVar108._4_4_);
                auVar80._8_4_ = (int)(auVar94._8_4_ + auVar108._8_4_);
                auVar80._12_4_ = (int)(auVar94._12_4_ + auVar108._12_4_);
                auVar87._16_4_ = (int)(auVar94._16_4_ + auVar108._16_4_);
                auVar87._0_16_ = auVar80;
                auVar87._20_4_ = (int)(auVar94._20_4_ + auVar108._20_4_);
                auVar87._24_4_ = (int)(auVar94._24_4_ + auVar108._24_4_);
                auVar87._28_4_ = (int)(in_ZMM9._28_4_ + auVar108._28_4_);
                auVar104._0_4_ = (int)(auVar114._0_4_ + auVar88._0_4_);
                auVar104._4_4_ = (int)(auVar114._4_4_ + auVar88._4_4_);
                auVar104._8_4_ = (int)(auVar114._8_4_ + auVar88._8_4_);
                auVar104._12_4_ = (int)(auVar114._12_4_ + auVar88._12_4_);
                auVar108._16_4_ = (int)(auVar114._16_4_ + auVar88._16_4_);
                auVar108._0_16_ = auVar104;
                auVar108._20_4_ = (int)(auVar114._20_4_ + auVar88._20_4_);
                auVar108._24_4_ = (int)(auVar114._24_4_ + auVar88._24_4_);
                auVar108._28_4_ = (int)(in_ZMM10._28_4_ + auVar88._28_4_);
                auVar80 = vpackssdw_avx(auVar80,auVar87._16_16_);
                auVar104 = vpackssdw_avx(auVar104,auVar108._16_16_);
                auVar80 = vpminsw_avx(auVar80,auVar43);
                auVar104 = vpminsw_avx(auVar104,auVar43);
                auVar80 = vpmaxsw_avx(auVar80,auVar47);
                auVar104 = vpmaxsw_avx(auVar104,auVar47);
                in_ZMM10 = ZEXT1664(auVar104);
                auVar80 = vpacksswb_avx(auVar80,auVar104);
                auVar80 = vpshufb_avx(auVar80,auVar5);
                in_ZMM9 = ZEXT1664(auVar80);
                *pauVar17 = auVar80;
                pauVar17 = pauVar17 + 1;
                pfVar22 = pfVar22 + 0x10;
                iVar12 = iVar12 + 2;
                uVar16 = uVar28;
              } while (iVar12 < max_kk);
            }
            iVar12 = max_kk - uVar16;
            if (iVar12 != 0 && (int)uVar16 <= max_kk) {
              do {
                auVar95._0_4_ = fVar31 * *pfVar22;
                auVar95._4_4_ = fVar32 * pfVar22[1];
                auVar95._8_4_ = fVar33 * pfVar22[2];
                auVar95._12_4_ = fVar34 * pfVar22[3];
                auVar95._16_4_ = fVar31 * pfVar22[4];
                auVar95._20_4_ = fVar32 * pfVar22[5];
                auVar95._28_36_ = in_ZMM9._28_36_;
                auVar95._24_4_ = fVar33 * pfVar22[6];
                auVar108 = vandps_avx(auVar95._0_32_,auVar38);
                auVar108 = vorps_avx(auVar108,auVar42);
                auVar81._0_4_ = (int)(auVar95._0_4_ + auVar108._0_4_);
                auVar81._4_4_ = (int)(auVar95._4_4_ + auVar108._4_4_);
                auVar81._8_4_ = (int)(auVar95._8_4_ + auVar108._8_4_);
                auVar81._12_4_ = (int)(auVar95._12_4_ + auVar108._12_4_);
                auVar88._16_4_ = (int)(auVar95._16_4_ + auVar108._16_4_);
                auVar88._0_16_ = auVar81;
                auVar88._20_4_ = (int)(auVar95._20_4_ + auVar108._20_4_);
                auVar88._24_4_ = (int)(auVar95._24_4_ + auVar108._24_4_);
                auVar88._28_4_ = (int)(in_ZMM9._28_4_ + auVar108._28_4_);
                in_ZMM10 = ZEXT1664(auVar88._16_16_);
                auVar80 = vpackssdw_avx(auVar81,auVar88._16_16_);
                auVar80 = vpminsw_avx(auVar80,auVar62);
                auVar80 = vpmaxsw_avx(auVar80,auVar75);
                auVar80 = vpacksswb_avx(auVar80,auVar80);
                in_ZMM9 = ZEXT1664(auVar80);
                *(long *)*pauVar17 = auVar80._0_8_;
                pauVar17 = (undefined1 (*) [16])(*pauVar17 + 8);
                pfVar22 = pfVar22 + 8;
                iVar12 = iVar12 + -1;
              } while (iVar12 != 0);
            }
          }
          if (iVar11 == 4) {
            uVar16 = 0;
            if (1 < max_kk) {
              iVar12 = 1;
              do {
                auVar96._0_4_ = fVar31 * *pfVar22;
                auVar96._4_4_ = fVar32 * pfVar22[1];
                auVar96._8_4_ = fVar33 * pfVar22[2];
                auVar96._12_4_ = fVar34 * pfVar22[3];
                auVar96._16_4_ = fVar31 * pfVar22[4];
                auVar96._20_4_ = fVar32 * pfVar22[5];
                auVar96._28_36_ = in_ZMM9._28_36_;
                auVar96._24_4_ = fVar33 * pfVar22[6];
                pfVar1 = pfVar22 + lVar20;
                auVar115._0_4_ = fVar31 * *pfVar1;
                auVar115._4_4_ = fVar32 * pfVar1[1];
                auVar115._8_4_ = fVar33 * pfVar1[2];
                auVar115._12_4_ = fVar34 * pfVar1[3];
                auVar115._16_4_ = fVar31 * pfVar1[4];
                auVar115._20_4_ = fVar32 * pfVar1[5];
                auVar115._28_36_ = in_ZMM10._28_36_;
                auVar115._24_4_ = fVar33 * pfVar1[6];
                auVar108 = vandps_avx(auVar96._0_32_,auVar38);
                auVar88 = vandps_avx(auVar115._0_32_,auVar38);
                auVar108 = vorps_avx(auVar108,auVar42);
                auVar88 = vorps_avx(auVar88,auVar42);
                auVar82._0_4_ = (int)(auVar96._0_4_ + auVar108._0_4_);
                auVar82._4_4_ = (int)(auVar96._4_4_ + auVar108._4_4_);
                auVar82._8_4_ = (int)(auVar96._8_4_ + auVar108._8_4_);
                auVar82._12_4_ = (int)(auVar96._12_4_ + auVar108._12_4_);
                auVar89._16_4_ = (int)(auVar96._16_4_ + auVar108._16_4_);
                auVar89._0_16_ = auVar82;
                auVar89._20_4_ = (int)(auVar96._20_4_ + auVar108._20_4_);
                auVar89._24_4_ = (int)(auVar96._24_4_ + auVar108._24_4_);
                auVar89._28_4_ = (int)(in_ZMM9._28_4_ + auVar108._28_4_);
                auVar105._0_4_ = (int)(auVar115._0_4_ + auVar88._0_4_);
                auVar105._4_4_ = (int)(auVar115._4_4_ + auVar88._4_4_);
                auVar105._8_4_ = (int)(auVar115._8_4_ + auVar88._8_4_);
                auVar105._12_4_ = (int)(auVar115._12_4_ + auVar88._12_4_);
                auVar109._16_4_ = (int)(auVar115._16_4_ + auVar88._16_4_);
                auVar109._0_16_ = auVar105;
                auVar109._20_4_ = (int)(auVar115._20_4_ + auVar88._20_4_);
                auVar109._24_4_ = (int)(auVar115._24_4_ + auVar88._24_4_);
                auVar109._28_4_ = (int)(in_ZMM10._28_4_ + auVar88._28_4_);
                auVar80 = vpackssdw_avx(auVar82,auVar89._16_16_);
                auVar104 = vpackssdw_avx(auVar105,auVar109._16_16_);
                auVar80 = vpminsw_avx(auVar80,auVar43);
                auVar104 = vpminsw_avx(auVar104,auVar43);
                auVar80 = vpmaxsw_avx(auVar80,auVar47);
                auVar104 = vpmaxsw_avx(auVar104,auVar47);
                in_ZMM10 = ZEXT1664(auVar104);
                auVar80 = vpacksswb_avx(auVar80,auVar104);
                auVar80 = vpshufb_avx(auVar80,auVar35);
                in_ZMM9 = ZEXT1664(auVar80);
                *pauVar17 = auVar80;
                pauVar17 = pauVar17 + 1;
                pfVar22 = pfVar22 + 8;
                iVar12 = iVar12 + 2;
                uVar16 = uVar28;
              } while (iVar12 < max_kk);
            }
            iVar12 = max_kk - uVar16;
            if (iVar12 != 0 && (int)uVar16 <= max_kk) {
              do {
                auVar6._4_4_ = pfVar22[1] * fVar32;
                auVar6._0_4_ = *pfVar22 * fVar31;
                auVar6._8_4_ = pfVar22[2] * fVar33;
                auVar6._12_4_ = pfVar22[3] * fVar34;
                auVar6._16_4_ = pfVar22[lVar20 + 4] * fVar31;
                auVar6._20_4_ = pfVar22[lVar20 + 5] * fVar32;
                auVar6._24_4_ = pfVar22[lVar20 + 6] * fVar33;
                auVar6._28_4_ = pfVar22[lVar20 + 7];
                auVar108 = vandps_avx(auVar6,auVar38);
                auVar108 = vorps_avx(auVar108,auVar42);
                auVar83._0_4_ = (int)(*pfVar22 * fVar31 + auVar108._0_4_);
                auVar83._4_4_ = (int)(pfVar22[1] * fVar32 + auVar108._4_4_);
                auVar83._8_4_ = (int)(pfVar22[2] * fVar33 + auVar108._8_4_);
                auVar83._12_4_ = (int)(pfVar22[3] * fVar34 + auVar108._12_4_);
                auVar90._16_4_ = (int)(pfVar22[lVar20 + 4] * fVar31 + auVar108._16_4_);
                auVar90._0_16_ = auVar83;
                auVar90._20_4_ = (int)(pfVar22[lVar20 + 5] * fVar32 + auVar108._20_4_);
                auVar90._24_4_ = (int)(pfVar22[lVar20 + 6] * fVar33 + auVar108._24_4_);
                auVar90._28_4_ = (int)(pfVar22[lVar20 + 7] + auVar108._28_4_);
                in_ZMM10 = ZEXT1664(auVar90._16_16_);
                auVar80 = vpackssdw_avx(auVar83,auVar90._16_16_);
                auVar80 = vpminsw_avx(auVar80,auVar62);
                auVar80 = vpmaxsw_avx(auVar80,auVar75);
                auVar80 = vpacksswb_avx(auVar80,auVar80);
                in_ZMM9 = ZEXT1664(auVar80);
                *(long *)*pauVar17 = auVar80._0_8_;
                pauVar17 = (undefined1 (*) [16])(*pauVar17 + 8);
                pfVar22 = pfVar22 + 4;
                iVar12 = iVar12 + -1;
              } while (iVar12 != 0);
            }
          }
          if (iVar11 == 1) {
            uVar16 = 0;
            pauVar25 = pauVar17;
            if (1 < max_kk) {
              iVar12 = 1;
              lVar19 = 0;
              do {
                auVar84._8_8_ = 0;
                auVar84._0_8_ = *(ulong *)((long)pfVar22 + lVar19);
                auVar80 = vinsertps_avx(auVar84,ZEXT416(*(uint *)((long)pfVar22 +
                                                                 lVar19 + lVar18 * 4)),0x20);
                auVar80 = vinsertps_avx(auVar80,ZEXT416(*(uint *)((long)pfVar22 +
                                                                 lVar19 + (long)(iVar3 + 1) * 4)),
                                        0x30);
                auVar91._16_8_ = *(undefined8 *)((long)pfVar22 + lVar19 + (long)(iVar3 * 2) * 4);
                auVar91._0_16_ = auVar80;
                auVar91._24_8_ = 0;
                uVar2 = *(undefined4 *)((long)pfVar22 + lVar19 + (long)(iVar3 * 3) * 4);
                auVar110._4_4_ = uVar2;
                auVar110._0_4_ = uVar2;
                auVar110._8_4_ = uVar2;
                auVar110._12_4_ = uVar2;
                auVar110._16_4_ = uVar2;
                auVar110._20_4_ = uVar2;
                auVar110._24_4_ = uVar2;
                auVar110._28_4_ = uVar2;
                auVar108 = vblendps_avx(auVar91,auVar110,0x40);
                uVar2 = *(undefined4 *)((long)pfVar22 + lVar19 + (long)(iVar3 * 3 + 1) * 4);
                auVar111._4_4_ = uVar2;
                auVar111._0_4_ = uVar2;
                auVar111._8_4_ = uVar2;
                auVar111._12_4_ = uVar2;
                auVar111._16_4_ = uVar2;
                auVar111._20_4_ = uVar2;
                auVar111._24_4_ = uVar2;
                auVar111._28_4_ = uVar2;
                auVar87 = vblendps_avx(auVar108,auVar111,0x80);
                auVar106._8_8_ = 0;
                auVar106._0_8_ = *(ulong *)((long)pfVar22 + lVar19 + lVar20 * 4);
                auVar80 = vinsertps_avx(auVar106,ZEXT416(*(uint *)((long)pfVar22 +
                                                                  lVar19 + (long)(iVar3 * 5) * 4)),
                                        0x20);
                auVar80 = vinsertps_avx(auVar80,ZEXT416(*(uint *)((long)pfVar22 +
                                                                 lVar19 + (long)(iVar3 * 5 + 1) * 4)
                                                       ),0x30);
                auVar112._16_8_ = *(undefined8 *)((long)pfVar22 + lVar19 + (long)(iVar3 * 6) * 4);
                auVar112._0_16_ = auVar80;
                auVar112._24_8_ = 0;
                uVar2 = *(undefined4 *)((long)pfVar22 + lVar19 + (long)iVar13 * 4);
                auVar122._4_4_ = uVar2;
                auVar122._0_4_ = uVar2;
                auVar122._8_4_ = uVar2;
                auVar122._12_4_ = uVar2;
                auVar122._16_4_ = uVar2;
                auVar122._20_4_ = uVar2;
                auVar122._24_4_ = uVar2;
                auVar122._28_4_ = uVar2;
                auVar108 = vblendps_avx(auVar112,auVar122,0x40);
                uVar2 = *(undefined4 *)((long)pfVar22 + lVar19 + (long)(iVar13 + 1) * 4);
                auVar123._4_4_ = uVar2;
                auVar123._0_4_ = uVar2;
                auVar123._8_4_ = uVar2;
                auVar123._12_4_ = uVar2;
                auVar123._16_4_ = uVar2;
                auVar123._20_4_ = uVar2;
                auVar123._24_4_ = uVar2;
                auVar123._28_4_ = uVar2;
                auVar89 = vblendps_avx(auVar108,auVar123,0x80);
                fVar79 = auVar87._0_4_ * fVar31;
                fVar97 = auVar87._4_4_ * fVar32;
                auVar7._4_4_ = fVar97;
                auVar7._0_4_ = fVar79;
                fVar98 = auVar87._8_4_ * fVar33;
                auVar7._8_4_ = fVar98;
                fVar99 = auVar87._12_4_ * fVar34;
                auVar7._12_4_ = fVar99;
                fVar100 = auVar87._16_4_ * fVar31;
                auVar7._16_4_ = fVar100;
                fVar101 = auVar87._20_4_ * fVar32;
                auVar7._20_4_ = fVar101;
                fVar102 = auVar87._24_4_ * fVar33;
                auVar7._24_4_ = fVar102;
                auVar7._28_4_ = auVar87._28_4_;
                fVar103 = auVar89._0_4_ * fVar31;
                fVar116 = auVar89._4_4_ * fVar32;
                auVar8._4_4_ = fVar116;
                auVar8._0_4_ = fVar103;
                fVar117 = auVar89._8_4_ * fVar33;
                auVar8._8_4_ = fVar117;
                fVar118 = auVar89._12_4_ * fVar34;
                auVar8._12_4_ = fVar118;
                fVar119 = auVar89._16_4_ * fVar31;
                auVar8._16_4_ = fVar119;
                fVar120 = auVar89._20_4_ * fVar32;
                auVar8._20_4_ = fVar120;
                fVar121 = auVar89._24_4_ * fVar33;
                auVar8._24_4_ = fVar121;
                auVar8._28_4_ = auVar89._28_4_;
                auVar108 = vandps_avx(auVar7,auVar38);
                auVar88 = vandps_avx(auVar8,auVar38);
                auVar108 = vorps_avx(auVar108,auVar42);
                auVar88 = vorps_avx(auVar88,auVar42);
                auVar85._0_4_ = (int)(fVar79 + auVar108._0_4_);
                auVar85._4_4_ = (int)(fVar97 + auVar108._4_4_);
                auVar85._8_4_ = (int)(fVar98 + auVar108._8_4_);
                auVar85._12_4_ = (int)(fVar99 + auVar108._12_4_);
                auVar92._16_4_ = (int)(fVar100 + auVar108._16_4_);
                auVar92._0_16_ = auVar85;
                auVar92._20_4_ = (int)(fVar101 + auVar108._20_4_);
                auVar92._24_4_ = (int)(fVar102 + auVar108._24_4_);
                auVar92._28_4_ = (int)(auVar87._28_4_ + auVar108._28_4_);
                auVar107._0_4_ = (int)(fVar103 + auVar88._0_4_);
                auVar107._4_4_ = (int)(fVar116 + auVar88._4_4_);
                auVar107._8_4_ = (int)(fVar117 + auVar88._8_4_);
                auVar107._12_4_ = (int)(fVar118 + auVar88._12_4_);
                auVar113._16_4_ = (int)(fVar119 + auVar88._16_4_);
                auVar113._0_16_ = auVar107;
                auVar113._20_4_ = (int)(fVar120 + auVar88._20_4_);
                auVar113._24_4_ = (int)(fVar121 + auVar88._24_4_);
                auVar113._28_4_ = (int)(auVar89._28_4_ + auVar88._28_4_);
                auVar80 = vpackssdw_avx(auVar85,auVar92._16_16_);
                auVar104 = vpackssdw_avx(auVar107,auVar113._16_16_);
                auVar80 = vpminsw_avx(auVar80,auVar43);
                auVar104 = vpminsw_avx(auVar104,auVar43);
                auVar80 = vpmaxsw_avx(auVar80,auVar47);
                auVar104 = vpmaxsw_avx(auVar104,auVar47);
                in_ZMM10 = ZEXT1664(auVar104);
                auVar80 = vpacksswb_avx(auVar80,auVar104);
                in_ZMM9 = ZEXT1664(auVar80);
                *(undefined1 (*) [16])(*pauVar17 + lVar19 * 2) = auVar80;
                pauVar25 = pauVar25 + 1;
                lVar19 = lVar19 + 8;
                iVar12 = iVar12 + 2;
              } while (iVar12 < max_kk);
              pfVar22 = (float *)((long)pfVar22 + lVar19);
              uVar16 = uVar28;
            }
            pauVar17 = pauVar25;
            if ((int)uVar16 < max_kk) {
              lVar19 = 0;
              do {
                auVar80 = vinsertps_avx(ZEXT416((uint)pfVar22[lVar20 + lVar19]),
                                        ZEXT416((uint)pfVar22[iVar3 * 5 + lVar19]),0x10);
                auVar80 = vinsertps_avx(auVar80,ZEXT416((uint)pfVar22[iVar3 * 6 + lVar19]),0x20);
                auVar80 = vinsertps_avx(auVar80,ZEXT416((uint)pfVar22[iVar13 + lVar19]),0x30);
                auVar104 = vinsertps_avx(ZEXT416((uint)pfVar22[lVar19]),
                                         ZEXT416((uint)pfVar22[lVar18 + lVar19]),0x10);
                auVar104 = vinsertps_avx(auVar104,ZEXT416((uint)pfVar22[iVar3 * 2 + lVar19]),0x20);
                auVar104 = vinsertps_avx(auVar104,ZEXT416((uint)pfVar22[iVar3 * 3 + lVar19]),0x30);
                fVar79 = auVar104._0_4_ * fVar31;
                fVar97 = auVar104._4_4_ * fVar32;
                auVar9._4_4_ = fVar97;
                auVar9._0_4_ = fVar79;
                fVar98 = auVar104._8_4_ * fVar33;
                auVar9._8_4_ = fVar98;
                fVar99 = auVar104._12_4_ * fVar34;
                auVar9._12_4_ = fVar99;
                fVar100 = auVar80._0_4_ * fVar31;
                auVar9._16_4_ = fVar100;
                fVar101 = auVar80._4_4_ * fVar32;
                auVar9._20_4_ = fVar101;
                fVar102 = auVar80._8_4_ * fVar33;
                auVar9._24_4_ = fVar102;
                auVar9._28_4_ = auVar80._12_4_;
                auVar108 = vandps_avx(auVar9,auVar38);
                auVar108 = vorps_avx(auVar108,auVar42);
                auVar86._0_4_ = (int)(fVar79 + auVar108._0_4_);
                auVar86._4_4_ = (int)(fVar97 + auVar108._4_4_);
                auVar86._8_4_ = (int)(fVar98 + auVar108._8_4_);
                auVar86._12_4_ = (int)(fVar99 + auVar108._12_4_);
                auVar93._16_4_ = (int)(fVar100 + auVar108._16_4_);
                auVar93._0_16_ = auVar86;
                auVar93._20_4_ = (int)(fVar101 + auVar108._20_4_);
                auVar93._24_4_ = (int)(fVar102 + auVar108._24_4_);
                auVar93._28_4_ = (int)(auVar80._12_4_ + auVar108._28_4_);
                in_ZMM10 = ZEXT1664(auVar93._16_16_);
                auVar80 = vpackssdw_avx(auVar86,auVar93._16_16_);
                auVar80 = vpminsw_avx(auVar80,auVar62);
                auVar80 = vpmaxsw_avx(auVar80,auVar75);
                auVar80 = vpacksswb_avx(auVar80,auVar80);
                in_ZMM9 = ZEXT1664(auVar80);
                *(long *)(*pauVar25 + lVar19 * 8) = auVar80._0_8_;
                pauVar17 = (undefined1 (*) [16])(*pauVar17 + 8);
                lVar19 = lVar19 + 1;
              } while (max_kk - uVar16 != (int)lVar19);
            }
          }
          uVar24 = uVar21 + 8;
          uVar15 = uVar21 + 0xf;
          uVar21 = uVar24;
        } while (uVar15 < (uint)max_jj);
      }
      lVar20 = (long)max_jj;
      if ((int)((uint)uVar24 | 3) < max_jj) {
        pvVar4 = B->data;
        auVar5 = vshufps_avx(auVar10,auVar10,0);
        auVar35._8_4_ = 0x80000000;
        auVar35._0_8_ = 0x8000000080000000;
        auVar35._12_4_ = 0x80000000;
        auVar39._8_4_ = 0x3f000000;
        auVar39._0_8_ = 0x3f0000003f000000;
        auVar39._12_4_ = 0x3f000000;
        auVar44._8_4_ = 0x7f007f;
        auVar44._0_8_ = 0x7f007f007f007f;
        auVar44._12_4_ = 0x7f007f;
        auVar48._8_4_ = 0xff81ff81;
        auVar48._0_8_ = 0xff81ff81ff81ff81;
        auVar48._12_4_ = 0xff81ff81;
        uVar21 = uVar24 & 0xffffffff;
        do {
          pfVar22 = (float *)((long)pvVar4 + (uVar21 + lVar26) * lVar18 * 4 + (long)(iVar11 * k) * 4
                             );
          fVar31 = auVar5._4_4_;
          fVar32 = auVar5._8_4_;
          fVar33 = auVar5._12_4_;
          fVar34 = auVar5._0_4_;
          if (iVar11 == 4) {
            uVar28 = 0;
            if (1 < max_kk) {
              iVar13 = 1;
              do {
                auVar51._0_4_ = fVar34 * *pfVar22;
                auVar51._4_4_ = fVar31 * pfVar22[1];
                auVar51._8_4_ = fVar32 * pfVar22[2];
                auVar51._12_4_ = fVar33 * pfVar22[3];
                auVar63._0_4_ = fVar34 * pfVar22[4];
                auVar63._4_4_ = fVar31 * pfVar22[5];
                auVar63._8_4_ = fVar32 * pfVar22[6];
                auVar63._12_4_ = fVar33 * pfVar22[7];
                auVar75 = vunpcklps_avx(auVar51,auVar63);
                auVar62 = vunpckhps_avx(auVar51,auVar63);
                auVar43 = vandps_avx(auVar75,auVar35);
                auVar47 = vandps_avx(auVar62,auVar35);
                auVar43 = vorps_avx(auVar43,auVar39);
                auVar47 = vorps_avx(auVar47,auVar39);
                auVar64._0_4_ = (int)(auVar75._0_4_ + auVar43._0_4_);
                auVar64._4_4_ = (int)(auVar75._4_4_ + auVar43._4_4_);
                auVar64._8_4_ = (int)(auVar75._8_4_ + auVar43._8_4_);
                auVar64._12_4_ = (int)(auVar75._12_4_ + auVar43._12_4_);
                auVar52._0_4_ = (int)(auVar47._0_4_ + auVar62._0_4_);
                auVar52._4_4_ = (int)(auVar47._4_4_ + auVar62._4_4_);
                auVar52._8_4_ = (int)(auVar47._8_4_ + auVar62._8_4_);
                auVar52._12_4_ = (int)(auVar47._12_4_ + auVar62._12_4_);
                auVar43 = vpackssdw_avx(auVar64,auVar52);
                auVar43 = vpminsw_avx(auVar43,auVar44);
                auVar43 = vpmaxsw_avx(auVar43,auVar48);
                auVar43 = vpacksswb_avx(auVar43,auVar43);
                *(long *)*pauVar17 = auVar43._0_8_;
                pauVar17 = (undefined1 (*) [16])(*pauVar17 + 8);
                pfVar22 = pfVar22 + 8;
                iVar13 = iVar13 + 2;
                uVar28 = max_kk & 0xfffffffeU;
              } while (iVar13 < max_kk);
            }
            iVar13 = max_kk - uVar28;
            if (iVar13 != 0 && (int)uVar28 <= max_kk) {
              do {
                auVar53._0_4_ = fVar34 * *pfVar22;
                auVar53._4_4_ = fVar31 * pfVar22[1];
                auVar53._8_4_ = fVar32 * pfVar22[2];
                auVar53._12_4_ = fVar33 * pfVar22[3];
                auVar43 = vandps_avx(auVar53,auVar35);
                auVar43 = vorps_avx(auVar43,auVar39);
                auVar54._0_4_ = (int)(auVar53._0_4_ + auVar43._0_4_);
                auVar54._4_4_ = (int)(auVar53._4_4_ + auVar43._4_4_);
                auVar54._8_4_ = (int)(auVar53._8_4_ + auVar43._8_4_);
                auVar54._12_4_ = (int)(auVar53._12_4_ + auVar43._12_4_);
                auVar43 = vpackssdw_avx(auVar54,auVar54);
                auVar43 = vpminsw_avx(auVar43,auVar44);
                auVar43 = vpmaxsw_avx(auVar43,auVar48);
                auVar43 = vpacksswb_avx(auVar43,auVar43);
                *(int *)*pauVar17 = auVar43._0_4_;
                pauVar17 = (undefined1 (*) [16])(*pauVar17 + 4);
                pfVar22 = pfVar22 + 4;
                iVar13 = iVar13 + -1;
              } while (iVar13 != 0);
            }
          }
          if (iVar11 == 1) {
            uVar28 = 0;
            if (1 < max_kk) {
              iVar13 = 1;
              lVar19 = 0;
              do {
                auVar55._8_8_ = 0;
                auVar55._0_8_ = *(ulong *)((long)pfVar22 + lVar19);
                auVar43 = vinsertps_avx(auVar55,ZEXT416(*(uint *)((long)pfVar22 +
                                                                 lVar19 + lVar18 * 4)),0x20);
                auVar43 = vinsertps_avx(auVar43,ZEXT416(*(uint *)((long)pfVar22 +
                                                                 lVar19 + (long)(iVar3 + 1) * 4)),
                                        0x30);
                auVar65._8_8_ = 0;
                auVar65._0_8_ = *(ulong *)((long)pfVar22 + lVar19 + (long)(iVar3 * 2) * 4);
                auVar47 = vinsertps_avx(auVar65,ZEXT416(*(uint *)((long)pfVar22 +
                                                                 lVar19 + (long)(iVar3 * 3) * 4)),
                                        0x20);
                auVar47 = vinsertps_avx(auVar47,ZEXT416(*(uint *)((long)pfVar22 +
                                                                 lVar19 + (long)(iVar3 * 3 + 1) * 4)
                                                       ),0x30);
                auVar56._0_4_ = auVar43._0_4_ * fVar34;
                auVar56._4_4_ = auVar43._4_4_ * fVar31;
                auVar56._8_4_ = auVar43._8_4_ * fVar32;
                auVar56._12_4_ = auVar43._12_4_ * fVar33;
                auVar66._0_4_ = auVar47._0_4_ * fVar34;
                auVar66._4_4_ = auVar47._4_4_ * fVar31;
                auVar66._8_4_ = auVar47._8_4_ * fVar32;
                auVar66._12_4_ = auVar47._12_4_ * fVar33;
                auVar43 = vandps_avx(auVar56,auVar35);
                auVar47 = vandps_avx(auVar66,auVar35);
                auVar43 = vorps_avx(auVar43,auVar39);
                auVar47 = vorps_avx(auVar47,auVar39);
                auVar57._0_4_ = (int)(auVar56._0_4_ + auVar43._0_4_);
                auVar57._4_4_ = (int)(auVar56._4_4_ + auVar43._4_4_);
                auVar57._8_4_ = (int)(auVar56._8_4_ + auVar43._8_4_);
                auVar57._12_4_ = (int)(auVar56._12_4_ + auVar43._12_4_);
                auVar67._0_4_ = (int)(auVar47._0_4_ + auVar66._0_4_);
                auVar67._4_4_ = (int)(auVar47._4_4_ + auVar66._4_4_);
                auVar67._8_4_ = (int)(auVar47._8_4_ + auVar66._8_4_);
                auVar67._12_4_ = (int)(auVar47._12_4_ + auVar66._12_4_);
                auVar43 = vpackssdw_avx(auVar57,auVar67);
                auVar43 = vpminsw_avx(auVar43,auVar44);
                auVar43 = vpmaxsw_avx(auVar43,auVar48);
                auVar43 = vpacksswb_avx(auVar43,auVar43);
                *(long *)(*pauVar17 + lVar19) = auVar43._0_8_;
                lVar19 = lVar19 + 8;
                iVar13 = iVar13 + 2;
              } while (iVar13 < max_kk);
              pauVar17 = (undefined1 (*) [16])(*pauVar17 + lVar19);
              pfVar22 = (float *)((long)pfVar22 + lVar19);
              uVar28 = max_kk & 0xfffffffeU;
            }
            if ((int)uVar28 < max_kk) {
              lVar19 = 0;
              do {
                auVar43 = vinsertps_avx(ZEXT416((uint)pfVar22[lVar19]),
                                        ZEXT416((uint)pfVar22[lVar18 + lVar19]),0x10);
                auVar43 = vinsertps_avx(auVar43,ZEXT416((uint)pfVar22[iVar3 * 2 + lVar19]),0x20);
                auVar43 = vinsertps_avx(auVar43,ZEXT416((uint)pfVar22[iVar3 * 3 + lVar19]),0x30);
                auVar58._0_4_ = auVar43._0_4_ * fVar34;
                auVar58._4_4_ = auVar43._4_4_ * fVar31;
                auVar58._8_4_ = auVar43._8_4_ * fVar32;
                auVar58._12_4_ = auVar43._12_4_ * fVar33;
                auVar43 = vandps_avx(auVar58,auVar35);
                auVar43 = vorps_avx(auVar43,auVar39);
                auVar59._0_4_ = (int)(auVar58._0_4_ + auVar43._0_4_);
                auVar59._4_4_ = (int)(auVar58._4_4_ + auVar43._4_4_);
                auVar59._8_4_ = (int)(auVar58._8_4_ + auVar43._8_4_);
                auVar59._12_4_ = (int)(auVar58._12_4_ + auVar43._12_4_);
                auVar43 = vpackssdw_avx(auVar59,auVar59);
                auVar43 = vpminsw_avx(auVar43,auVar44);
                auVar43 = vpmaxsw_avx(auVar43,auVar48);
                auVar43 = vpacksswb_avx(auVar43,auVar43);
                *(int *)*pauVar17 = auVar43._0_4_;
                pauVar17 = (undefined1 (*) [16])(*pauVar17 + 4);
                lVar19 = lVar19 + 1;
              } while (max_kk - uVar28 != (int)lVar19);
            }
          }
          uVar24 = uVar21 + 4;
          lVar19 = uVar21 + 7;
          uVar21 = uVar24;
        } while (lVar19 < lVar20);
      }
      lVar19 = (long)k;
      if ((int)((uint)uVar24 | 1) < max_jj) {
        auVar5 = vshufps_avx(auVar10,auVar10,0);
        lVar30 = (uVar24 & 0xffffffff) + lVar26;
        lVar23 = (lVar30 * 4 + 4) * lVar18 + lVar19 * 4;
        lVar30 = lVar19 * 4 + lVar30 * lVar18 * 4;
        auVar36._8_4_ = 0x80000000;
        auVar36._0_8_ = 0x8000000080000000;
        auVar36._12_4_ = 0x80000000;
        auVar40._8_4_ = 0x3f000000;
        auVar40._0_8_ = 0x3f0000003f000000;
        auVar40._12_4_ = 0x3f000000;
        auVar45._8_4_ = 0x7f007f;
        auVar45._0_8_ = 0x7f007f007f007f;
        auVar45._12_4_ = 0x7f007f;
        auVar49._8_4_ = 0xff81ff81;
        auVar49._0_8_ = 0xff81ff81ff81ff81;
        auVar49._12_4_ = 0xff81ff81;
        auVar60._8_4_ = 0x3effffff;
        auVar60._0_8_ = 0x3effffff3effffff;
        auVar60._12_4_ = 0x3effffff;
        uVar21 = uVar24 & 0xffffffff;
        do {
          pvVar4 = B->data;
          puVar27 = (ulong *)((long)pvVar4 + lVar19 * 4 + (uVar21 + lVar26) * lVar18 * 4);
          fVar32 = auVar5._4_4_;
          fVar33 = auVar5._8_4_;
          fVar34 = auVar5._12_4_;
          fVar31 = auVar5._0_4_;
          if (max_kk < 4) {
            uVar28 = 0;
          }
          else {
            iVar11 = 3;
            lVar29 = 0;
            do {
              pfVar22 = (float *)((long)pvVar4 + lVar29 * 2 + lVar30);
              auVar68._0_4_ = fVar31 * *pfVar22;
              auVar68._4_4_ = fVar32 * pfVar22[1];
              auVar68._8_4_ = fVar33 * pfVar22[2];
              auVar68._12_4_ = fVar34 * pfVar22[3];
              pfVar22 = (float *)((long)pvVar4 + lVar29 * 2 + lVar23);
              auVar76._0_4_ = fVar31 * *pfVar22;
              auVar76._4_4_ = fVar32 * pfVar22[1];
              auVar76._8_4_ = fVar33 * pfVar22[2];
              auVar76._12_4_ = fVar34 * pfVar22[3];
              auVar43 = vmovlhps_avx(auVar68,auVar76);
              auVar47 = vunpckhpd_avx(auVar68,auVar76);
              auVar35 = vandps_avx(auVar43,auVar36);
              auVar39 = vandps_avx(auVar47,auVar36);
              auVar35 = vorps_avx(auVar35,auVar40);
              auVar39 = vorps_avx(auVar39,auVar40);
              auVar77._0_4_ = (int)(auVar43._0_4_ + auVar35._0_4_);
              auVar77._4_4_ = (int)(auVar43._4_4_ + auVar35._4_4_);
              auVar77._8_4_ = (int)(auVar43._8_4_ + auVar35._8_4_);
              auVar77._12_4_ = (int)(auVar43._12_4_ + auVar35._12_4_);
              auVar69._0_4_ = (int)(auVar39._0_4_ + auVar47._0_4_);
              auVar69._4_4_ = (int)(auVar39._4_4_ + auVar47._4_4_);
              auVar69._8_4_ = (int)(auVar39._8_4_ + auVar47._8_4_);
              auVar69._12_4_ = (int)(auVar39._12_4_ + auVar47._12_4_);
              auVar35 = vpackssdw_avx(auVar77,auVar69);
              auVar35 = vpminsw_avx(auVar35,auVar45);
              auVar35 = vpmaxsw_avx(auVar35,auVar49);
              auVar35 = vpacksswb_avx(auVar35,auVar35);
              *(long *)(*pauVar17 + lVar29) = auVar35._0_8_;
              puVar27 = puVar27 + 2;
              lVar29 = lVar29 + 8;
              iVar11 = iVar11 + 4;
            } while (iVar11 < max_kk);
            pauVar17 = (undefined1 (*) [16])(*pauVar17 + lVar29);
            uVar28 = max_kk & 0xfffffffc;
          }
          uVar16 = uVar28 | 1;
          while ((int)uVar16 < max_kk) {
            auVar70._8_8_ = 0;
            auVar70._0_8_ = *(ulong *)((long)puVar27 + lVar18 * 4);
            auVar78._8_8_ = 0;
            auVar78._0_8_ = *puVar27;
            auVar35 = vmovlhps_avx(auVar78,auVar70);
            auVar71._0_4_ = fVar31 * auVar35._0_4_;
            auVar71._4_4_ = fVar32 * auVar35._4_4_;
            auVar71._8_4_ = fVar33 * auVar35._8_4_;
            auVar71._12_4_ = fVar34 * auVar35._12_4_;
            auVar35 = vandps_avx(auVar71,auVar36);
            auVar35 = vorps_avx(auVar35,auVar40);
            auVar72._0_4_ = (int)(auVar71._0_4_ + auVar35._0_4_);
            auVar72._4_4_ = (int)(auVar71._4_4_ + auVar35._4_4_);
            auVar72._8_4_ = (int)(auVar71._8_4_ + auVar35._8_4_);
            auVar72._12_4_ = (int)(auVar71._12_4_ + auVar35._12_4_);
            auVar35 = vpackssdw_avx(auVar72,auVar72);
            auVar35 = vpminsw_avx(auVar35,auVar45);
            auVar35 = vpmaxsw_avx(auVar35,auVar49);
            auVar35 = vpacksswb_avx(auVar35,auVar35);
            *(int *)*pauVar17 = auVar35._0_4_;
            pauVar17 = (undefined1 (*) [16])(*pauVar17 + 4);
            puVar27 = puVar27 + 1;
            uVar16 = uVar28 + 3;
            uVar28 = uVar28 + 2;
          }
          if ((int)uVar28 < max_kk) {
            lVar29 = 0;
            do {
              fVar31 = scale * *(float *)((long)puVar27 + lVar29 * 4);
              auVar35 = vandps_avx(ZEXT416((uint)fVar31),auVar36);
              auVar35 = vorps_avx(auVar35,auVar60);
              auVar35 = ZEXT416((uint)(fVar31 + auVar35._0_4_));
              auVar35 = vroundss_avx(auVar35,auVar35,0xb);
              iVar11 = (int)auVar35._0_4_;
              if (iVar11 < -0x7e) {
                iVar11 = -0x7f;
              }
              if (0x7e < iVar11) {
                iVar11 = 0x7f;
              }
              (*pauVar17)[0] = (char)iVar11;
              fVar31 = scale * *(float *)((long)puVar27 + lVar29 * 4 + lVar18 * 4);
              auVar35 = vandps_avx(ZEXT416((uint)fVar31),auVar36);
              auVar35 = vorps_avx(auVar35,auVar60);
              auVar35 = ZEXT416((uint)(fVar31 + auVar35._0_4_));
              auVar35 = vroundss_avx(auVar35,auVar35,0xb);
              iVar11 = (int)auVar35._0_4_;
              if (iVar11 < -0x7e) {
                iVar11 = -0x7f;
              }
              if (0x7e < iVar11) {
                iVar11 = 0x7f;
              }
              (*pauVar17)[1] = (char)iVar11;
              pauVar17 = (undefined1 (*) [16])(*pauVar17 + 2);
              lVar29 = lVar29 + 1;
            } while (max_kk - uVar28 != (int)lVar29);
          }
          uVar24 = uVar21 + 2;
          lVar29 = uVar21 + 3;
          lVar23 = lVar23 + lVar18 * 8;
          lVar30 = lVar30 + lVar18 * 8;
          uVar21 = uVar24;
        } while (lVar29 < lVar20);
      }
      if ((int)uVar24 < max_jj) {
        auVar5 = vshufps_avx(auVar10,auVar10,0);
        lVar30 = (long)(int)uVar24;
        auVar37._8_4_ = 0x80000000;
        auVar37._0_8_ = 0x8000000080000000;
        auVar37._12_4_ = 0x80000000;
        auVar41._8_4_ = 0x3f000000;
        auVar41._0_8_ = 0x3f0000003f000000;
        auVar41._12_4_ = 0x3f000000;
        auVar46._8_4_ = 0x7f007f;
        auVar46._0_8_ = 0x7f007f007f007f;
        auVar46._12_4_ = 0x7f007f;
        auVar50._8_4_ = 0xff81ff81;
        auVar50._0_8_ = 0xff81ff81ff81ff81;
        auVar50._12_4_ = 0xff81ff81;
        auVar61._8_4_ = 0x3effffff;
        auVar61._0_8_ = 0x3effffff3effffff;
        auVar61._12_4_ = 0x3effffff;
        do {
          pfVar22 = (float *)((long)B->data + lVar19 * 4 + (lVar30 + lVar26) * lVar18 * 4);
          if (max_kk < 4) {
            uVar28 = 0;
          }
          else {
            iVar11 = 3;
            do {
              auVar73._0_4_ = auVar5._0_4_ * *pfVar22;
              auVar73._4_4_ = auVar5._4_4_ * pfVar22[1];
              auVar73._8_4_ = auVar5._8_4_ * pfVar22[2];
              auVar73._12_4_ = auVar5._12_4_ * pfVar22[3];
              auVar35 = vandps_avx(auVar73,auVar37);
              auVar35 = vorps_avx(auVar35,auVar41);
              auVar74._0_4_ = (int)(auVar73._0_4_ + auVar35._0_4_);
              auVar74._4_4_ = (int)(auVar73._4_4_ + auVar35._4_4_);
              auVar74._8_4_ = (int)(auVar73._8_4_ + auVar35._8_4_);
              auVar74._12_4_ = (int)(auVar73._12_4_ + auVar35._12_4_);
              auVar35 = vpackssdw_avx(auVar74,auVar74);
              auVar35 = vpminsw_avx(auVar35,auVar46);
              auVar35 = vpmaxsw_avx(auVar35,auVar50);
              auVar35 = vpacksswb_avx(auVar35,auVar35);
              *(int *)*pauVar17 = auVar35._0_4_;
              pauVar17 = (undefined1 (*) [16])(*pauVar17 + 4);
              pfVar22 = pfVar22 + 4;
              iVar11 = iVar11 + 4;
              uVar28 = max_kk & 0xfffffffc;
            } while (iVar11 < max_kk);
          }
          if ((int)uVar28 < max_kk) {
            lVar23 = 0;
            do {
              auVar35 = vandps_avx(ZEXT416((uint)(scale * pfVar22[lVar23])),auVar37);
              auVar35 = vorps_avx(auVar35,auVar61);
              auVar35 = ZEXT416((uint)(scale * pfVar22[lVar23] + auVar35._0_4_));
              auVar35 = vroundss_avx(auVar35,auVar35,0xb);
              iVar11 = (int)auVar35._0_4_;
              if (iVar11 < -0x7e) {
                iVar11 = -0x7f;
              }
              if (0x7e < iVar11) {
                iVar11 = 0x7f;
              }
              (*pauVar17)[lVar23] = (char)iVar11;
              lVar23 = lVar23 + 1;
            } while (max_kk - uVar28 != (int)lVar23);
            pauVar17 = (undefined1 (*) [16])(*pauVar17 + lVar23);
          }
          lVar30 = lVar30 + 1;
        } while (lVar30 != lVar20);
      }
      return;
    }
    pack_B_tile_fp32_to_int8_avx2(B,BT,j,max_jj,k,max_kk,scale);
    return;
  }
  pack_B_tile_fp32_to_int8_avxvnni(B,BT,j,max_jj,k,max_kk,scale);
  return;
}

Assistant:

static void pack_B_tile_quantize(const Mat& B, Mat& BT, int j, int max_jj, int k, int max_kk, float scale)
{
    pack_B_tile_fp32_to_int8(B, BT, j, max_jj, k, max_kk, scale);
}